

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_pushbool(HSQUIRRELVM v,SQBool b)

{
  SQObjectPtr local_18;
  
  local_18.super_SQObject._unVal.nInteger._1_7_ = 0;
  local_18.super_SQObject._unVal.nInteger._0_1_ = b != 0;
  local_18.super_SQObject._type = OT_BOOL;
  SQVM::Push(v,&local_18);
  SQObjectPtr::~SQObjectPtr(&local_18);
  return;
}

Assistant:

void sq_pushbool(HSQUIRRELVM v,SQBool b)
{
    v->Push(b?true:false);
}